

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crange.cpp
# Opt level: O3

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* CRange::process(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *__return_storage_ptr__,
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *commands,short sswitch,
                 vector<CRange::Tdata,_std::allocator<CRange::Tdata>_> *targets)

{
  double dVar1;
  int iVar2;
  istream *piVar3;
  ostream *poVar4;
  pointer pbVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  long local_458;
  istringstream c;
  byte abStack_438 [88];
  ios_base local_3e0 [264];
  long local_2d8;
  ostringstream r;
  uint auStack_2c0 [22];
  ios_base local_268 [264];
  undefined1 local_160 [8];
  Tdata target;
  vector<CRange::RangeTable,_std::allocator<CRange::RangeTable>_> rt;
  size_type *local_a0;
  string task;
  string targname;
  double red2;
  double a1;
  double local_48;
  double red1;
  double z1;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pbVar5 = (commands->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((commands->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != pbVar5) {
    target._hash = 0.0;
    do {
      std::__cxx11::istringstream::istringstream((istringstream *)&local_458,(string *)pbVar5,_S_in)
      ;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2d8);
      local_a0 = &task._M_string_length;
      task._M_dataplus._M_p = (pointer)0x0;
      task._M_string_length._0_1_ = 0;
      task.field_2._8_8_ = &targname._M_string_length;
      targname._M_dataplus._M_p = (pointer)0x0;
      targname._M_string_length._0_1_ = 0;
      piVar3 = std::operator>>((istream *)&local_458,(string *)&local_a0);
      piVar3 = std::istream::_M_extract<double>((double *)piVar3);
      piVar3 = std::istream::_M_extract<double>((double *)piVar3);
      piVar3 = std::istream::_M_extract<double>((double *)piVar3);
      piVar3 = std::istream::_M_extract<double>((double *)piVar3);
      std::operator>>(piVar3,(string *)(task.field_2._M_local_buf + 8));
      if ((abStack_438[*(long *)(local_458 + -0x18)] & 2) == 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Invalid command detected: ",0x1a);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,(pbVar5->_M_dataplus)._M_p,
                            pbVar5->_M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
        uVar6 = 0;
        uVar7 = 0xc0c38780;
      }
      else {
        find_target((Tdata *)local_160,(string *)((long)&task.field_2 + 8),targets);
        iVar2 = std::__cxx11::string::compare((char *)local_160);
        if (iVar2 == 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Invalid target detected in command: ",0x24);
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,(pbVar5->_M_dataplus)._M_p,
                              pbVar5->_M_string_length);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
LAB_0010a29b:
          std::ostream::put((char)poVar4);
          std::ostream::flush();
          uVar6 = 0;
          uVar7 = 0xc0c38780;
        }
        else {
          iVar2 = std::__cxx11::string::compare((char *)&local_a0);
          if (iVar2 == 0) {
            dVar1 = range(local_48,red1,red2,sswitch,(Tdata *)local_160,
                          (vector<CRange::RangeTable,_std::allocator<CRange::RangeTable>_> *)
                          &target._hash);
            uVar6 = SUB84(dVar1,0);
            uVar7 = (undefined4)((ulong)dVar1 >> 0x20);
          }
          else {
            iVar2 = std::__cxx11::string::compare((char *)&local_a0);
            if (iVar2 == 0) {
              dVar1 = renergy(local_48,(double)targname.field_2._8_8_,red1,red2,sswitch,
                              (Tdata *)local_160,
                              (vector<CRange::RangeTable,_std::allocator<CRange::RangeTable>_> *)
                              &target._hash);
              uVar6 = SUB84(dVar1,0);
              uVar7 = (undefined4)((ulong)dVar1 >> 0x20);
            }
            else {
              iVar2 = std::__cxx11::string::compare((char *)&local_a0);
              if (iVar2 == 0) {
                dVar1 = dedx(local_48,(double)targname.field_2._8_8_,red1,red2,sswitch,
                             (Tdata *)local_160);
                uVar6 = SUB84(dVar1,0);
                uVar7 = (undefined4)((ulong)dVar1 >> 0x20);
              }
              else {
                iVar2 = std::__cxx11::string::compare((char *)&local_a0);
                if (iVar2 != 0) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,"Invalid task detected in command: ",0x22);
                  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                                     ((ostream *)&std::cerr,(pbVar5->_M_dataplus)._M_p,
                                      pbVar5->_M_string_length);
                  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
                  goto LAB_0010a29b;
                }
                dVar1 = djdx(local_48,red1,2.0,0.05,3.04,sswitch,(Tdata *)local_160);
                uVar6 = SUB84(dVar1,0);
                uVar7 = (undefined4)((ulong)dVar1 >> 0x20);
              }
            }
          }
        }
        if (local_160 != (undefined1  [8])&target._name._M_string_length) {
          operator_delete((void *)local_160);
        }
      }
      *(undefined8 *)(&r + *(long *)(local_2d8 + -0x18)) = 6;
      *(uint *)((long)auStack_2c0 + *(long *)(local_2d8 + -0x18)) =
           *(uint *)((long)auStack_2c0 + *(long *)(local_2d8 + -0x18)) & 0xfffffefb | 4;
      std::ostream::_M_insert<double>((double)CONCAT44(uVar7,uVar6));
      std::__cxx11::stringbuf::str();
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 __return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160);
      if (local_160 != (undefined1  [8])&target._name._M_string_length) {
        operator_delete((void *)local_160);
      }
      if ((size_type *)task.field_2._8_8_ != &targname._M_string_length) {
        operator_delete((void *)task.field_2._8_8_);
      }
      if (local_a0 != &task._M_string_length) {
        operator_delete(local_a0);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_2d8);
      std::ios_base::~ios_base(local_268);
      std::__cxx11::istringstream::~istringstream((istringstream *)&local_458);
      std::ios_base::~ios_base(local_3e0);
      pbVar5 = pbVar5 + 1;
    } while (pbVar5 != (commands->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish);
    std::vector<CRange::RangeTable,_std::allocator<CRange::RangeTable>_>::~vector
              ((vector<CRange::RangeTable,_std::allocator<CRange::RangeTable>_> *)&target._hash);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> CRange::process( std::vector<std::string> &commands, short sswitch, std::vector<CRange::Tdata> &targets )
{
    std::vector<std::string> results;
    if (commands.size() == 0) return results;
    std::vector<CRange::RangeTable> rt;
    for (std::vector<std::string>::iterator it=commands.begin(); it != commands.end(); ++it) {
        std::istringstream c(*it);
        std::ostringstream r;
        std::string task, targname;
        double red1, red2, z1, a1;
        double out = -9999.0;
        c >> task >> red1 >> red2 >> z1 >> a1 >> targname;
        //
        // c.good() will be false, even on a good read, because a good read
        // will also reach the end of input, so we test eof instead.
        //
        if (c.eof()) {
            CRange::Tdata target = CRange::find_target(targname, targets);
            if (target.name() == "Unknown") {
                std::cerr << "Invalid target detected in command: " << *it << std::endl;
            } else {
                if (task == "r") {
                    out = CRange::range(red1,z1,a1,sswitch,target,rt);
                } else if (task == "e") {
                    out = CRange::renergy(red1,red2,z1,a1,sswitch,target,rt);
                } else if (task == "d") {
                    out = CRange::dedx(red1,red2,z1,a1,sswitch,target);
                } else if (task == "j") {
                    out = CRange::djdx(red1, z1, 2.0, 0.05, 3.04, sswitch, target);
                } else {
                    std::cerr << "Invalid task detected in command: " << *it << std::endl;
                }
            }
        } else {
            std::cerr << "Invalid command detected: " << *it << std::endl;
        }
        r << std::setprecision(6) << std::fixed << out;
        // r << std::setprecision(5) << std::scientific << out;
        results.push_back(r.str());
    }
    return results;
}